

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Type_Conversion chaiscript::base_class<TestBaseType,TestDerivedType>(void)

{
  Type_Conversion_Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Type_Conversion TVar1;
  
  __p = (Type_Conversion_Base *)operator_new(0x38);
  (__p->m_to).m_type_info = (type_info *)&TestBaseType::typeinfo;
  (__p->m_to).m_bare_type_info = (type_info *)&TestBaseType::typeinfo;
  (__p->m_to).m_flags = 0;
  (__p->m_from).m_type_info = (type_info *)&TestDerivedType::typeinfo;
  (__p->m_from).m_bare_type_info = (type_info *)&TestDerivedType::typeinfo;
  (__p->m_from).m_flags = 0;
  __p->_vptr_Type_Conversion_Base = (_func_int **)&PTR_convert_00176e08;
  in_RDI->_vptr_Type_Conversion_Base = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::detail::Type_Conversion_Base*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->m_to,__p);
  TVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  TVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Type_Conversion)
         TVar1.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Type_Conversion base_class() {
    // Can only be used with related polymorphic types
    // may be expanded some day to support conversions other than child -> parent
    static_assert(std::is_base_of<Base, Derived>::value, "Classes are not related by inheritance");

    if constexpr (std::is_polymorphic<Base>::value && std::is_polymorphic<Derived>::value) {
      return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Dynamic_Conversion_Impl<Base, Derived>>();
    } else {
      return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Static_Conversion_Impl<Base, Derived>>();
    }
  }